

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O3

ExprBase * AnalyzeClassPrototype(ExpressionContext *ctx,SynClassPrototype *syntax)

{
  TypeBase *pTVar1;
  uint nameHash;
  int iVar2;
  TypeClass *this;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *in_R8;
  InplaceStr IVar4;
  SynIdentifier local_78;
  ExprBase *pEVar3;
  
  IVar4.end = in_R8;
  IVar4.begin = (syntax->name->name).end;
  anon_unknown.dwarf_c3752::CheckTypeConflict
            ((anon_unknown_dwarf_c3752 *)ctx,(ExpressionContext *)syntax,
             (SynBase *)(syntax->name->name).begin,IVar4);
  IVar4 = GetTypeNameInScope(ctx,ctx->scope,syntax->name->name);
  nameHash = NULLC::GetStringHash(IVar4.begin,IVar4.end);
  this = (TypeClass *)
         anon_unknown.dwarf_c3752::LookupTypeByName
                   ((anon_unknown_dwarf_c3752 *)ctx->scope,(ExpressionContext *)ctx->lookupLocation,
                    nameHash);
  if (this == (TypeClass *)0x0) {
    iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x180);
    this = (TypeClass *)CONCAT44(extraout_var,iVar2);
    local_78.super_SynBase.begin = (syntax->name->super_SynBase).begin;
    local_78.super_SynBase.end = (syntax->name->super_SynBase).end;
    local_78.super_SynBase.typeID = 4;
    if (local_78.super_SynBase.begin == (Lexeme *)0x0) {
      local_78.super_SynBase.pos.begin = (char *)0x0;
    }
    else {
      local_78.super_SynBase.pos.begin = (local_78.super_SynBase.begin)->pos;
    }
    if (local_78.super_SynBase.end == (Lexeme *)0x0) {
      local_78.super_SynBase.pos.end = (char *)0x0;
    }
    else {
      local_78.super_SynBase.pos.end =
           (local_78.super_SynBase.end)->pos + (local_78.super_SynBase.end)->length;
    }
    if (local_78.super_SynBase.pos.end < local_78.super_SynBase.pos.begin) {
      __assert_fail("strEnd >= strBegin",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/StrAlgo.h"
                    ,0x28,"InplaceStr::InplaceStr(const char *, const char *)");
    }
    local_78.super_SynBase.next = (SynBase *)0x0;
    local_78.super_SynBase.listed = false;
    local_78.super_SynBase.isInternal = false;
    local_78.super_SynBase._vptr_SynBase = (_func_int **)&PTR__SynBase_0023f0c0;
    local_78.name = IVar4;
    TypeClass::TypeClass
              (this,ctx->allocator,&local_78,&syntax->super_SynBase,ctx->scope,
               (TypeGenericClassProto *)0x0,(IntrusiveList<MatchData>)ZEXT816(0),false,
               (TypeClass *)0x0);
    ExpressionContext::AddType(ctx,(TypeBase *)this);
  }
  else if (((this->super_TypeStruct).super_TypeBase.typeID != 0x18) || (this->completed != false)) {
    anon_unknown.dwarf_c3752::Stop
              (ctx,&syntax->super_SynBase,"ERROR: \'%.*s\' is being redefined",
               (ulong)(uint)(*(int *)&(syntax->name->name).end - (int)(syntax->name->name).begin));
  }
  iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
  pEVar3 = (ExprBase *)CONCAT44(extraout_var_00,iVar2);
  pTVar1 = ctx->typeVoid;
  pEVar3->typeID = 0x2b;
  pEVar3->source = &syntax->super_SynBase;
  pEVar3->type = pTVar1;
  pEVar3->next = (ExprBase *)0x0;
  pEVar3->listed = false;
  pEVar3->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_002411b8;
  pEVar3[1]._vptr_ExprBase = (_func_int **)this;
  return pEVar3;
}

Assistant:

ExprBase* AnalyzeClassPrototype(ExpressionContext &ctx, SynClassPrototype *syntax)
{
	CheckTypeConflict(ctx, syntax, syntax->name->name);

	InplaceStr typeName = GetTypeNameInScope(ctx, ctx.scope, syntax->name->name);

	if(TypeBase *type = LookupTypeByName(ctx, typeName.hash()))
	{
		TypeClass *originalDefinition = getType<TypeClass>(type);

		if(!originalDefinition || originalDefinition->completed)
			Stop(ctx, syntax, "ERROR: '%.*s' is being redefined", FMT_ISTR(syntax->name->name));

		return new (ctx.get<ExprClassPrototype>()) ExprClassPrototype(syntax, ctx.typeVoid, originalDefinition);
	}

	IntrusiveList<MatchData> actualGenerics;

	TypeClass *classType = new (ctx.get<TypeClass>()) TypeClass(ctx.allocator, SynIdentifier(syntax->name, typeName), syntax, ctx.scope, NULL, actualGenerics, false, NULL);

	ctx.AddType(classType);

	return new (ctx.get<ExprClassPrototype>()) ExprClassPrototype(syntax, ctx.typeVoid, classType);
}